

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O3

int PixarLogEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  long lVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  uint8_t *puVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  float fVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ushort *puVar20;
  char *pcVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ushort *puVar25;
  uint uVar26;
  float *pfVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  uint local_58;
  
  puVar11 = tif->tif_data;
  uVar18 = *(uint *)(puVar11 + 0x108);
  if (uVar18 - 2 < 3) {
    cc = (ulong)cc >> 1;
  }
  else if (1 < uVar18) {
    if (uVar18 != 5) {
      uVar3 = (tif->tif_dir).td_bitspersample;
LAB_002ae091:
      TIFFErrorExtR(tif,"PixarLogEncode","%u bit input not supported in PixarLog",(ulong)uVar3);
      return 0;
    }
    cc = (ulong)cc >> 2;
  }
  uVar18 = (uint)*(ushort *)(puVar11 + 0x100) * (tif->tif_dir).td_imagewidth;
  lVar19 = (long)(int)uVar18;
  if ((long)((ulong)(tif->tif_dir).td_rowsperstrip * lVar19) < cc) {
    pcVar21 = "Too many input bytes provided";
  }
  else {
    puVar20 = *(ushort **)(puVar11 + 0xf8);
    if (0 < cc) {
      lVar14 = lVar19 * 2;
      lVar1 = lVar19 * 4;
      uVar26 = uVar18 + 4;
      uVar16 = uVar18 + 3;
      lVar29 = 0;
      do {
        fVar15 = Fltsize;
        iVar17 = *(int *)(puVar11 + 0x108);
        if (iVar17 == 0) {
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar28 = lVar19;
          if ((int)(uint)uVar3 <= (int)uVar18) {
            lVar12 = *(long *)(puVar11 + 0x148);
            uVar23 = (uint)uVar3;
            if (uVar23 == 3) {
              uVar5 = *(ushort *)(lVar12 + (ulong)*bp * 2);
              *puVar20 = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 1) * 2);
              puVar20[1] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 2) * 2);
              puVar20[2] = uVar3;
              if (3 < uVar18) {
                lVar32 = 5;
                uVar23 = uVar16;
                do {
                  uVar4 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32 + -2) * 2);
                  puVar20[lVar32 + -2] = uVar4 - uVar5 & 0x7ff;
                  uVar7 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32 + -1) * 2);
                  puVar20[lVar32 + -1] = uVar7 - uVar6 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32) * 2);
                  puVar20[lVar32] = uVar8 - uVar3 & 0x7ff;
                  lVar32 = lVar32 + 3;
                  uVar23 = uVar23 - 3;
                  uVar5 = uVar4;
                  uVar6 = uVar7;
                  uVar3 = uVar8;
                } while (6 < uVar23);
              }
            }
            else if (uVar23 == 4) {
              uVar6 = *(ushort *)(lVar12 + (ulong)*bp * 2);
              *puVar20 = uVar6;
              uVar5 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 1) * 2);
              puVar20[1] = uVar5;
              uVar4 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 2) * 2);
              puVar20[2] = uVar4;
              uVar3 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + 3) * 2);
              puVar20[3] = uVar3;
              if (4 < uVar18) {
                lVar32 = 7;
                uVar23 = uVar26;
                do {
                  uVar7 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32 + -3) * 2);
                  puVar20[lVar32 + -3] = uVar7 - uVar6 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32 + -2) * 2);
                  puVar20[lVar32 + -2] = uVar8 - uVar5 & 0x7ff;
                  uVar9 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32 + -1) * 2);
                  puVar20[lVar32 + -1] = uVar9 - uVar4 & 0x7ff;
                  uVar10 = *(ushort *)(lVar12 + (ulong)*(byte *)((long)bp + lVar32) * 2);
                  puVar20[lVar32] = uVar10 - uVar3 & 0x7ff;
                  lVar32 = lVar32 + 4;
                  uVar23 = uVar23 - 4;
                  uVar6 = uVar7;
                  uVar5 = uVar8;
                  uVar4 = uVar9;
                  uVar3 = uVar10;
                } while (8 < uVar23);
              }
            }
            else {
              uVar24 = uVar3 + 1;
              puVar25 = puVar20;
              pfVar27 = (float *)bp;
              uVar22 = uVar24;
              do {
                *puVar25 = *(ushort *)(lVar12 + (ulong)*(byte *)pfVar27 * 2);
                puVar25 = puVar25 + 1;
                pfVar27 = (float *)((long)pfVar27 + 1);
                uVar22 = uVar22 - 1;
              } while (1 < uVar22);
              if (uVar18 - uVar23 != 0 && (int)uVar23 <= (int)uVar18) {
                uVar22 = uVar24;
                iVar17 = uVar18 - uVar23;
                do {
                  do {
                    *puVar25 = *(short *)(lVar12 + (ulong)*(byte *)pfVar27 * 2) -
                               *(short *)(lVar12 + (ulong)*(byte *)((long)pfVar27 - (ulong)uVar3) *
                                                   2) & 0x7ff;
                    puVar25 = puVar25 + 1;
                    pfVar27 = (float *)((long)pfVar27 + 1);
                    uVar22 = uVar22 - 1;
                  } while (1 < (int)uVar22);
                  iVar30 = iVar17 - (uint)uVar3;
                  bVar13 = (int)(uint)uVar3 <= iVar17;
                  uVar22 = uVar24;
                  iVar17 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        else if (iVar17 == 4) {
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar28 = lVar14;
          if ((int)(uint)uVar3 <= (int)uVar18) {
            lVar12 = *(long *)(puVar11 + 0x140);
            uVar23 = (uint)uVar3;
            if (uVar23 == 3) {
              uVar3 = *(ushort *)(lVar12 + (ulong)(*(ushort *)bp >> 2) * 2);
              *puVar20 = uVar3;
              uVar6 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 2) >> 2) * 2);
              puVar20[1] = uVar6;
              uVar5 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 4) >> 2) * 2);
              puVar20[2] = uVar5;
              if (3 < uVar18) {
                lVar32 = 10;
                uVar23 = uVar16;
                do {
                  uVar4 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar32 + -4) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32 + -4) = uVar4 - uVar3 & 0x7ff;
                  uVar7 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar32 + -2) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32 + -2) = uVar7 - uVar6 & 0x7ff;
                  uVar8 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + lVar32) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32) = uVar8 - uVar5 & 0x7ff;
                  lVar32 = lVar32 + 6;
                  uVar23 = uVar23 - 3;
                  uVar3 = uVar4;
                  uVar6 = uVar7;
                  uVar5 = uVar8;
                } while (6 < uVar23);
              }
            }
            else if (uVar23 == 4) {
              uVar4 = *(ushort *)(lVar12 + (ulong)(*(ushort *)bp >> 2) * 2);
              *puVar20 = uVar4;
              uVar5 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 2) >> 2) * 2);
              puVar20[1] = uVar5;
              uVar6 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 4) >> 2) * 2);
              puVar20[2] = uVar6;
              uVar3 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + 6) >> 2) * 2);
              puVar20[3] = uVar3;
              if (4 < uVar18) {
                lVar32 = 0xe;
                uVar23 = uVar26;
                do {
                  uVar7 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar32 + -6) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32 + -6) = uVar7 - uVar4 & 0x7ff;
                  uVar8 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar32 + -4) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32 + -4) = uVar8 - uVar5 & 0x7ff;
                  uVar9 = *(ushort *)
                           (lVar12 + (ulong)(*(ushort *)((long)bp + lVar32 + -2) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32 + -2) = uVar9 - uVar6 & 0x7ff;
                  uVar10 = *(ushort *)(lVar12 + (ulong)(*(ushort *)((long)bp + lVar32) >> 2) * 2);
                  *(ushort *)((long)puVar20 + lVar32) = uVar10 - uVar3 & 0x7ff;
                  lVar32 = lVar32 + 8;
                  uVar23 = uVar23 - 4;
                  uVar4 = uVar7;
                  uVar5 = uVar8;
                  uVar6 = uVar9;
                  uVar3 = uVar10;
                } while (8 < uVar23);
              }
            }
            else {
              uVar24 = uVar3 + 1;
              puVar25 = puVar20;
              pfVar27 = (float *)bp;
              uVar22 = uVar24;
              do {
                *puVar25 = *(ushort *)(lVar12 + (ulong)(*(ushort *)pfVar27 >> 2) * 2);
                puVar25 = puVar25 + 1;
                pfVar27 = (float *)((long)pfVar27 + 2);
                uVar22 = uVar22 - 1;
              } while (1 < uVar22);
              if (uVar18 - uVar23 != 0 && (int)uVar23 <= (int)uVar18) {
                uVar22 = uVar24;
                iVar17 = uVar18 - uVar23;
                do {
                  do {
                    *puVar25 = *(short *)(lVar12 + (ulong)(*(ushort *)pfVar27 >> 2) * 2) -
                               *(short *)(lVar12 + (ulong)(*(ushort *)
                                                            ((long)pfVar27 -
                                                            (ulong)((uint)uVar3 + (uint)uVar3)) >> 2
                                                          ) * 2) & 0x7ff;
                    puVar25 = puVar25 + 1;
                    pfVar27 = (float *)((long)pfVar27 + 2);
                    uVar22 = uVar22 - 1;
                  } while (1 < (int)uVar22);
                  iVar30 = iVar17 - (uint)uVar3;
                  bVar13 = (int)(uint)uVar3 <= iVar17;
                  uVar22 = uVar24;
                  iVar17 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        else {
          if (iVar17 != 5) {
            uVar3 = (tif->tif_dir).td_bitspersample;
            goto LAB_002ae091;
          }
          uVar3 = *(ushort *)(puVar11 + 0x100);
          lVar28 = lVar1;
          if ((int)(uint)uVar3 <= (int)uVar18) {
            lVar12 = *(long *)(puVar11 + 0x138);
            if (uVar3 == 3) {
              fVar2 = *(float *)bp;
              dVar34 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar34 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar34 = (double)LogK1;
                    dVar37 = log((double)(fVar2 * LogK2));
                    dVar34 = dVar37 * dVar34 + 0.5;
                  }
                }
                else {
                  dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * Fltsize) * 2);
                }
              }
              dVar37 = 0.0;
              *puVar20 = (ushort)(int)dVar34;
              fVar2 = *(float *)((long)bp + 4);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar37 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar37 = log((double)(fVar2 * LogK2));
                    dVar37 = dVar37 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar37 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[1] = (ushort)(int)dVar37;
              fVar2 = *(float *)((long)bp + 8);
              dVar35 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar35 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar35 = dVar38 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[2] = (ushort)(int)dVar35;
              if (3 < uVar18) {
                lVar32 = 10;
                uVar23 = (int)dVar34 & 0xffff;
                uVar22 = (int)dVar37 & 0xffff;
                uVar24 = (int)dVar35 & 0xffff;
                uVar31 = uVar16;
                do {
                  fVar2 = *(float *)((long)bp + lVar32 * 2 + -8);
                  dVar34 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar34 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar34 = (double)LogK1;
                        dVar37 = log((double)(fVar2 * LogK2));
                        dVar34 = dVar37 * dVar34 + 0.5;
                      }
                    }
                    else {
                      dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar37 = 0.0;
                  *(ushort *)((long)puVar20 + lVar32 + -4) =
                       (short)(int)dVar34 - (short)uVar23 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar32 * 2 + -4);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar37 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar37 = log((double)(fVar2 * LogK2));
                        dVar37 = dVar37 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar37 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar32 + -2) =
                       (short)(int)dVar37 - (short)uVar22 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar32 * 2);
                  dVar35 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar35 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar35 = dVar38 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar32) = (short)(int)dVar35 - (short)uVar24 & 0x7ff;
                  uVar31 = uVar31 - 3;
                  lVar32 = lVar32 + 6;
                  uVar23 = (int)dVar34;
                  uVar22 = (int)dVar37;
                  uVar24 = (int)dVar35;
                } while (6 < uVar31);
              }
            }
            else if (uVar3 == 4) {
              fVar2 = *(float *)bp;
              dVar34 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar34 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar34 = (double)LogK1;
                    dVar37 = log((double)(fVar2 * LogK2));
                    dVar34 = dVar37 * dVar34 + 0.5;
                  }
                }
                else {
                  dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * Fltsize) * 2);
                }
              }
              dVar37 = 0.0;
              *puVar20 = (ushort)(int)dVar34;
              fVar2 = *(float *)((long)bp + 4);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar37 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar37 = log((double)(fVar2 * LogK2));
                    dVar37 = dVar37 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar37 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[1] = (ushort)(int)dVar37;
              fVar2 = *(float *)((long)bp + 8);
              dVar35 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar35 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar35 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar35 = dVar38 * dVar35 + 0.5;
                  }
                }
                else {
                  dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              dVar38 = 0.0;
              puVar20[2] = (ushort)(int)dVar35;
              fVar2 = *(float *)((long)bp + 0xc);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar38 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar36 = (double)LogK1;
                    dVar38 = log((double)(fVar2 * LogK2));
                    dVar38 = dVar38 * dVar36 + 0.5;
                  }
                }
                else {
                  dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                }
              }
              puVar20[3] = (ushort)(int)dVar38;
              if (4 < uVar18) {
                lVar32 = 0xe;
                uVar23 = (int)dVar34 & 0xffff;
                uVar22 = (int)dVar37 & 0xffff;
                uVar24 = (int)dVar35 & 0xffff;
                uVar31 = (int)dVar38 & 0xffff;
                uVar33 = uVar26;
                do {
                  fVar2 = *(float *)((long)bp + lVar32 * 2 + -0xc);
                  dVar34 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar34 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar34 = (double)LogK1;
                        dVar37 = log((double)(fVar2 * LogK2));
                        dVar34 = dVar37 * dVar34 + 0.5;
                      }
                    }
                    else {
                      dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar37 = 0.0;
                  *(ushort *)((long)puVar20 + lVar32 + -6) =
                       (short)(int)dVar34 - (short)uVar23 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar32 * 2 + -8);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar37 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar37 = log((double)(fVar2 * LogK2));
                        dVar37 = dVar37 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar37 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar32 + -4) =
                       (short)(int)dVar37 - (short)uVar22 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar32 * 2 + -4);
                  dVar35 = 0.0;
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar35 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar35 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar35 = dVar38 * dVar35 + 0.5;
                      }
                    }
                    else {
                      dVar35 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  dVar38 = 0.0;
                  *(ushort *)((long)puVar20 + lVar32 + -2) =
                       (short)(int)dVar35 - (short)uVar24 & 0x7ff;
                  fVar2 = *(float *)((long)bp + lVar32 * 2);
                  if (0.0 <= fVar2) {
                    if (2.0 <= fVar2) {
                      dVar38 = 2047.0;
                      if (fVar2 <= 24.2) {
                        dVar36 = (double)LogK1;
                        dVar38 = log((double)(fVar2 * LogK2));
                        dVar38 = dVar38 * dVar36 + 0.5;
                      }
                    }
                    else {
                      dVar38 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                    }
                  }
                  *(ushort *)((long)puVar20 + lVar32) = (short)(int)dVar38 - (short)uVar31 & 0x7ff;
                  uVar33 = uVar33 - 4;
                  lVar32 = lVar32 + 8;
                  uVar23 = (int)dVar34;
                  uVar22 = (int)dVar37;
                  uVar24 = (int)dVar35;
                  uVar31 = (int)dVar38;
                } while (8 < uVar33);
              }
            }
            else {
              uVar22 = uVar3 + 1;
              puVar25 = puVar20;
              pfVar27 = (float *)bp;
              uVar23 = uVar22;
              do {
                fVar2 = *pfVar27;
                dVar34 = 0.0;
                if (0.0 <= fVar2) {
                  if (2.0 <= fVar2) {
                    dVar34 = 2047.0;
                    if (fVar2 <= 24.2) {
                      dVar34 = (double)LogK1;
                      dVar37 = log((double)(fVar2 * LogK2));
                      dVar34 = dVar37 * dVar34 + 0.5;
                    }
                  }
                  else {
                    dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                  }
                }
                *puVar25 = (ushort)(int)dVar34;
                puVar25 = puVar25 + 1;
                pfVar27 = pfVar27 + 1;
                uVar23 = uVar23 - 1;
              } while (1 < uVar23);
              uVar23 = (uint)uVar3;
              if (uVar18 - uVar23 != 0 && (int)uVar23 <= (int)uVar18) {
                uVar24 = uVar22;
                iVar17 = uVar18 - uVar23;
                do {
                  do {
                    fVar2 = *pfVar27;
                    dVar34 = 0.0;
                    if (0.0 <= fVar2) {
                      if (2.0 <= fVar2) {
                        dVar34 = 2047.0;
                        if (fVar2 <= 24.2) {
                          dVar37 = (double)LogK1;
                          dVar34 = log((double)(fVar2 * LogK2));
                          dVar34 = dVar34 * dVar37 + 0.5;
                        }
                      }
                      else {
                        dVar34 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                      }
                    }
                    dVar37 = 0.0;
                    fVar2 = *(float *)((long)pfVar27 - (ulong)(uVar23 * 4));
                    if (0.0 <= fVar2) {
                      if (2.0 <= fVar2) {
                        dVar37 = 2047.0;
                        if (fVar2 <= 24.2) {
                          dVar35 = (double)LogK1;
                          dVar37 = log((double)(fVar2 * LogK2));
                          dVar37 = dVar37 * dVar35 + 0.5;
                        }
                      }
                      else {
                        dVar37 = (double)*(ushort *)(lVar12 + (long)(int)(fVar2 * fVar15) * 2);
                      }
                    }
                    *puVar25 = (short)(int)dVar34 - (short)(int)dVar37 & 0x7ff;
                    puVar25 = puVar25 + 1;
                    pfVar27 = pfVar27 + 1;
                    uVar24 = uVar24 - 1;
                  } while (1 < (int)uVar24);
                  local_58 = (uint)uVar3;
                  iVar30 = iVar17 - local_58;
                  bVar13 = (int)local_58 <= iVar17;
                  uVar24 = uVar22;
                  iVar17 = iVar30;
                } while (iVar30 != 0 && bVar13);
              }
            }
          }
        }
        bp = (uint8_t *)((long)bp + lVar28);
        lVar29 = lVar29 + lVar19;
        puVar20 = puVar20 + lVar19;
      } while (lVar29 < cc);
      puVar20 = *(ushort **)(puVar11 + 0xf8);
    }
    *(ushort **)(puVar11 + 0x80) = puVar20;
    *(int *)(puVar11 + 0x88) = (int)cc * 2;
    if (-1 < (int)cc) {
      do {
        iVar17 = deflate((z_streamp)(puVar11 + 0x80),0);
        if (iVar17 != 0) {
          pcVar21 = "(null)";
          if (*(char **)(puVar11 + 0xb0) != (char *)0x0) {
            pcVar21 = *(char **)(puVar11 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogEncode","Encoder error: %s",pcVar21);
          return 0;
        }
        if (*(int *)(puVar11 + 0xa0) == 0) {
          tif->tif_rawcc = tif->tif_rawdatasize;
          iVar17 = TIFFFlushData1(tif);
          if (iVar17 == 0) {
            return 0;
          }
          *(uint8_t **)(puVar11 + 0x98) = tif->tif_rawdata;
          *(int *)(puVar11 + 0xa0) = (int)tif->tif_rawdatasize;
        }
      } while (*(int *)(puVar11 + 0x88) != 0);
      return 1;
    }
    pcVar21 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogEncode",pcVar21);
  return 0;
}

Assistant:

static int PixarLogEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "PixarLogEncode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t n;
    int llen;
    unsigned short *up;

    (void)s;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            n = cc / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            n = cc / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            n = cc;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;
    /* Check against the number of elements (of size uint16_t) of sp->tbuf */
    if (n > ((tmsize_t)td->td_rowsperstrip * llen))
    {
        TIFFErrorExtR(tif, module, "Too many input bytes provided");
        return 0;
    }

    for (i = 0, up = sp->tbuf; i < n; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalDifferenceF((float *)bp, llen, sp->stride, up,
                                      sp->FromLT2);
                bp += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalDifference16((uint16_t *)bp, llen, sp->stride, up,
                                       sp->From14);
                bp += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalDifference8((unsigned char *)bp, llen, sp->stride, up,
                                      sp->From8);
                bp += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module,
                              "%" PRIu16 " bit input not supported in PixarLog",
                              td->td_bitspersample);
                return 0;
        }
    }

    sp->stream.next_in = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_in) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_in = (uInt)(n * sizeof(uint16_t));
    if ((sp->stream.avail_in / sizeof(uint16_t)) != (uInt)n)
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }

    do
    {
        if (deflate(&sp->stream, Z_NO_FLUSH) != Z_OK)
        {
            TIFFErrorExtR(tif, module, "Encoder error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (sp->stream.avail_out == 0)
        {
            tif->tif_rawcc = tif->tif_rawdatasize;
            if (!TIFFFlushData1(tif))
                return 0;
            sp->stream.next_out = tif->tif_rawdata;
            sp->stream.avail_out =
                (uInt)tif
                    ->tif_rawdatasize; /* this is a safe typecast, as check is
                                          made already in PixarLogPreEncode */
        }
    } while (sp->stream.avail_in > 0);
    return (1);
}